

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-getaddrinfo.c
# Opt level: O3

int run_benchmark_getaddrinfo(void)

{
  int extraout_EAX;
  int iVar1;
  int extraout_EAX_00;
  int extraout_EAX_01;
  addrinfo *ai;
  long lVar2;
  int iVar3;
  uv_getaddrinfo_t *req;
  uv_loop_t *handle;
  
  loop = uv_default_loop();
  uv_update_time(loop);
  start_time = uv_now(loop);
  lVar2 = 0;
  do {
    getaddrinfo_initiate((uv_getaddrinfo_t *)((long)handles[0].reserved + lVar2 + -0x10));
    lVar2 = lVar2 + 0xa0;
  } while (lVar2 != 0x640);
  req = (uv_getaddrinfo_t *)0x0;
  uv_run(loop,UV_RUN_DEFAULT);
  uv_update_time(loop);
  uv_now(loop);
  if (calls_initiated == 10000) {
    req = _stderr;
    if (calls_completed == 10000) {
      run_benchmark_getaddrinfo_cold_3();
      return 0;
    }
  }
  else {
    run_benchmark_getaddrinfo_cold_1();
  }
  run_benchmark_getaddrinfo_cold_2();
  calls_initiated = calls_initiated + 1;
  handle = loop;
  iVar1 = uv_getaddrinfo(loop,req,getaddrinfo_cb,"localhost",(char *)0x0,(addrinfo *)0x0);
  iVar3 = (int)req;
  if (iVar1 == 0) {
    return extraout_EAX;
  }
  getaddrinfo_initiate_cold_1();
  if (iVar3 == 0) {
    calls_completed = calls_completed + 1;
    if (calls_initiated < 10000) {
      getaddrinfo_initiate((uv_getaddrinfo_t *)handle);
    }
    uv_freeaddrinfo(ai);
    return extraout_EAX_00;
  }
  getaddrinfo_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)handle);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
  return extraout_EAX_01;
}

Assistant:

BENCHMARK_IMPL(getaddrinfo) {
  int i;

  loop = uv_default_loop();

  uv_update_time(loop);
  start_time = uv_now(loop);

  for (i = 0; i < CONCURRENT_CALLS; i++) {
    getaddrinfo_initiate(&handles[i]);
  }

  uv_run(loop, UV_RUN_DEFAULT);

  uv_update_time(loop);
  end_time = uv_now(loop);

  ASSERT(calls_initiated == TOTAL_CALLS);
  ASSERT(calls_completed == TOTAL_CALLS);

  fprintf(stderr, "getaddrinfo: %.0f req/s\n",
          (double) calls_completed / (double) (end_time - start_time) * 1000.0);
  fflush(stderr);

  MAKE_VALGRIND_HAPPY();
  return 0;
}